

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeTBLInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint RegNo;
  uint32_t uVar5;
  DecodeStatus DVar6;
  uint Rd;
  uint op;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,7,1);
  RegNo = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,6,1);
  DVar6 = DecodeDPRRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&Rm,DVar6);
  if (_Var1) {
    if (uVar5 != 0) {
      DVar6 = DecodeDPRRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    uVar4 = MCInst_getOpcode(pMStack_18);
    if ((uVar4 == 0x8a3) || (uVar4 == 0x8a9)) {
      DVar6 = DecodeDPairRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar6 = DecodeDPRRegisterClass(pMStack_18,uVar3 << 4 | uVar2,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar6);
    if (_Var1) {
      Inst_local._4_4_ = Rm;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeTBLInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, op;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 7, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	op = fieldFromInstruction_4(Insn, 6, 1);

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (op) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail; // Writeback
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VTBL2:
		case ARM_VTBX2:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}